

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void CopyBlock8b(uint8_t *dst,int dist,int length)

{
  ushort *dst_00;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int i;
  uint32_t pattern;
  uint8_t *src;
  uint32_t in_stack_ffffffffffffffe0;
  int iVar1;
  
  dst_00 = (ushort *)((long)in_RDI - (long)in_ESI);
  if (in_EDX < 8) {
LAB_001476cf:
    if (in_ESI < in_EDX) {
      for (iVar1 = 0; iVar1 < in_EDX; iVar1 = iVar1 + 1) {
        *(byte *)((long)in_RDI + (long)iVar1) = *(byte *)((long)dst_00 + (long)iVar1);
      }
    }
    else {
      memcpy(in_RDI,dst_00,(long)in_EDX);
    }
  }
  else {
    if (in_ESI == 1) {
      iVar1 = (uint)(byte)*dst_00 * 0x1010101;
    }
    else if (in_ESI == 2) {
      iVar1 = (uint)*dst_00 * 0x10001;
    }
    else {
      if (in_ESI != 4) goto LAB_001476cf;
      iVar1 = *(int *)dst_00;
    }
    CopySmallPattern8b((uint8_t *)CONCAT44(in_ESI,in_EDX),(uint8_t *)dst_00,iVar1,
                       in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

static WEBP_INLINE void CopyBlock8b(uint8_t* const dst, int dist, int length) {
  const uint8_t* src = dst - dist;
  if (length >= 8) {
    uint32_t pattern = 0;
    switch (dist) {
      case 1:
        pattern = src[0];
#if defined(__arm__) || defined(_M_ARM)   // arm doesn't like multiply that much
        pattern |= pattern << 8;
        pattern |= pattern << 16;
#elif defined(WEBP_USE_MIPS_DSP_R2)
        __asm__ volatile ("replv.qb %0, %0" : "+r"(pattern));
#else
        pattern = 0x01010101u * pattern;
#endif
        break;
      case 2:
#if !defined(WORDS_BIGENDIAN)
        memcpy(&pattern, src, sizeof(uint16_t));
#else
        pattern = ((uint32_t)src[0] << 8) | src[1];
#endif
#if defined(__arm__) || defined(_M_ARM)
        pattern |= pattern << 16;
#elif defined(WEBP_USE_MIPS_DSP_R2)
        __asm__ volatile ("replv.ph %0, %0" : "+r"(pattern));
#else
        pattern = 0x00010001u * pattern;
#endif
        break;
      case 4:
        memcpy(&pattern, src, sizeof(uint32_t));
        break;
      default:
        goto Copy;
    }
    CopySmallPattern8b(src, dst, length, pattern);
    return;
  }
 Copy:
  if (dist >= length) {  // no overlap -> use memcpy()
    memcpy(dst, src, length * sizeof(*dst));
  } else {
    int i;
    for (i = 0; i < length; ++i) dst[i] = src[i];
  }
}